

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

bool __thiscall log_queue::push(log_queue *this,log_entry *f)

{
  size_type sVar1;
  undefined1 local_30 [7];
  bool was_empty;
  unique_lock<std::mutex> lock;
  log_entry *f_local;
  log_queue *this_local;
  
  lock._8_8_ = f;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->queue_mutex);
  if ((this->active & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = std::
            queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
            ::size(&this->queue);
    std::
    queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
    ::push(&this->queue,(value_type *)&lock._M_owns);
    if (sVar1 == 0) {
      std::condition_variable::notify_one();
    }
    this_local._7_1_ = true;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool push(log_entry* f) {
            std::unique_lock<std::mutex> lock(queue_mutex);

            if (active) {
                bool was_empty = (queue.size() == 0);
                queue.push(f);

                if (was_empty) {
                    wait_for_next_item_condition.notify_one();
                }

                return true;
            }

            return false;
        }